

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanBGPlanner.cpp
# Opt level: O0

VectorSet * __thiscall
MonahanBGPlanner::ComputeGaoa
          (MonahanBGPlanner *this,GaoVectorSet *Gao,ValueFunctionPOMDPDiscrete *V,Index a,Index o,
          Index aPrime)

{
  Index IVar1;
  size_type sVar2;
  const_reference this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar3;
  VectorSet *pVVar4;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RDX;
  Index in_R9D;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar9 [16];
  double g_a_o_vk_s;
  double R_s_a_o;
  Index s;
  vector<double,_std::allocator<double>_> v1;
  Index k;
  double gamma;
  VectorSet *vGao;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  v;
  Index in_stack_fffffffffffffe98;
  Index in_stack_fffffffffffffe9c;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffea0;
  value_type *in_stack_fffffffffffffea8;
  allocator_type *in_stack_fffffffffffffeb0;
  reference in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  index in_stack_fffffffffffffec8;
  const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
  *in_stack_fffffffffffffed0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffee0;
  multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  *in_stack_fffffffffffffee8;
  undefined4 local_a8;
  undefined4 local_84;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x93ae93);
  boost::
  multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
  ::operator[](in_stack_fffffffffffffee8,(index)in_stack_fffffffffffffee0);
  boost::detail::multi_array::
  const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
  ::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  boost::detail::multi_array::
  const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
  ::~const_sub_array((const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>
                      *)0x93aef3);
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  dVar5 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x93af27);
  local_84 = 0;
  while( true ) {
    sVar2 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(in_RDX);
    if (local_84 == sVar2) break;
    this_00 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[]
                        (in_RDX,(ulong)local_84);
    IVar1 = AlphaVector::GetAction(this_00);
    if (IVar1 == in_R9D) {
      AlphaVectorPlanning::GetPU
                ((AlphaVectorPlanning *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      PlanningUnitMADPDiscrete::GetNrStates
                (&in_stack_fffffffffffffea0->super_PlanningUnitMADPDiscrete);
      std::allocator<double>::allocator((allocator<double> *)0x93afeb);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8,
                 in_stack_fffffffffffffeb0);
      std::allocator<double>::~allocator((allocator<double> *)0x93b011);
      local_a8 = 0;
      while( true ) {
        pvVar3 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(ulong)local_a8;
        AlphaVectorPlanning::GetPU
                  ((AlphaVectorPlanning *)
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        in_stack_fffffffffffffee0 =
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)PlanningUnitMADPDiscrete::GetNrStates
                          (&in_stack_fffffffffffffea0->super_PlanningUnitMADPDiscrete);
        auVar7 = in_ZMM1._0_16_;
        if (pvVar3 == in_stack_fffffffffffffee0) break;
        AlphaVectorPlanning::GetPU
                  ((AlphaVectorPlanning *)
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        dVar6 = PlanningUnitDecPOMDPDiscrete::GetReward
                          (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                           in_stack_fffffffffffffe98);
        AlphaVectorPlanning::GetPU
                  ((AlphaVectorPlanning *)
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        in_stack_fffffffffffffec0 =
             (vector<double,_std::allocator<double>_> *)
             PlanningUnitMADPDiscrete::GetNrJointObservations((PlanningUnitMADPDiscrete *)0x93b0b2);
        auVar7 = vcvtusi2sd_avx512f(auVar7,in_stack_fffffffffffffec0);
        in_stack_fffffffffffffeb8 =
             boost::numeric::ublas::
             matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                           *)in_stack_fffffffffffffea0,
                          CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),0x93b0f6);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar6 / auVar7._0_8_;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dVar5;
        in_ZMM1 = ZEXT1664(auVar8);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *in_stack_fffffffffffffeb8;
        auVar7 = vfmadd213sd_fma(auVar7,auVar8,auVar9);
        in_stack_fffffffffffffea8 = auVar7._0_8_;
        in_stack_fffffffffffffeb0 =
             (allocator_type *)
             std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0,
                        CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        *(value_type **)in_stack_fffffffffffffeb0 = in_stack_fffffffffffffea8;
        local_a8 = local_a8 + 1;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffeb0);
    }
    local_84 = local_84 + 1;
  }
  pVVar4 = AlphaVectorPlanning::VectorOfVectorsToVectorSet(in_stack_fffffffffffffee0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffeb0);
  return pVVar4;
}

Assistant:

VectorSet* MonahanBGPlanner::ComputeGaoa(const GaoVectorSet &Gao,
                                         const ValueFunctionPOMDPDiscrete &V,
                                         Index a,
                                         Index o,
                                         Index aPrime) const
{
    vector<vector<double> > v;
    //for the current a,o, beta, we are now going to construct a set of vectors...
    //  Note: the tech-report specifies the value for a (joint) belief. Therefore
    //  it is possible to select the maximizing back-projected vector (g_ao^v') in
    //  (3.22).
    //
    //  In contrast, here we are generating the the vectors over the complete 
    //  joint belief space. As such, we can not generate the vector 
    //  v*_{b,a,\beta} as done in (3.22). Instead we generate the set of possible
    //      v_{a,\beta}^k   = R_a + \sum_{o} g_{ao}^v'[k] 
    //                      = \sum_{o} [  (R_a / |o|) +  g_{ao}^v'[k]  ]      (A)
    //                                    ==========================
    //                                           
    //  
    //  (   Note that, because each \beta will specify at least one different joint action
    //      (for one joint observation), the set of v_{a,\beta}^k vectors generated for 
    //      different \beta are in fact different.                                            ) 
    //
    //!!HOWEVER!! these vectors that are called 'v1' below corresponds to the  
    //  part of (A) in brackets. It just adds (an 1/|o| fraction of) the immediate
    //  reward to  g_{ao}^v[k], which is just some back projected vector. Let us call 
    //  this new function 'rg'. I.e.:
    //
    //      rg_ao^k = (R_a / |o|) +  g_{ao}^v'[k]
    //
    //  while it is the case that each \beta will only be consistent with a subset of these
    //  vectors, it is *NOT* the case that each \beta specifies completely different sets of
    //  rg vectors!!!
    //
    //  As such, it does not make sense to have G[a][o][betaI] store sets of rg_ao^k,
    //  many of which contain duplicates!
    //
    //  INSTEAD I propose the following:
    //      1) store G[a][o][a'], the set of rg_ao^k such that v'[k] specifies a'
    //      2) then in 'cross-sum' only loop over the a' consistent with the jpol
    //

    //a pointer used to point to different vectors in Gao
    VectorSet *vGao=Gao[a][o];
    double gamma=GetPU()->GetDiscount();

    for(Index k=0;k!=V.size();k++) //for each vector v[k] in V^t+1
    {
        //if the vector V[k] specifies the joint action that is consistent with \beta (see (3.15))
        if(V[k].GetAction()==aPrime)
        {
            vector<double> v1(GetPU()->GetNrStates());
            for(Index s=0;s!=GetPU()->GetNrStates();s++)
            {
                //the immediate reward is divided equally over the vectors:   
                double R_s_a_o = (GetPU()->GetReward(s,a)) / GetPU()->GetNrJointObservations();
                
                //the following is just one of the vectors g_ao^v[k] (g_{ao}^{v^{t+1}_a'}) from (3.15)
                double g_a_o_vk_s =  (*vGao)(k,s);
                v1.at(s) =  R_s_a_o + gamma * g_a_o_vk_s;
            }
            v.push_back(v1);
        }
    }
    return(VectorOfVectorsToVectorSet(v));
}